

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

bool CoreML::Specification::operator==(CustomModel *a,CustomModel *b)

{
  size_t __n;
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  puVar2 = (undefined8 *)((ulong)(a->classname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  puVar3 = (undefined8 *)((ulong)(b->classname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  __n = puVar2[1];
  if (__n != puVar3[1]) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp((void *)*puVar2,(void *)*puVar3,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }